

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

uint8 * __thiscall
caffe::BlobShape::InternalSerializeWithCachedSizesToArray
          (BlobShape *this,bool deterministic,uint8 *target)

{
  void *pvVar1;
  bool bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  uint uVar5;
  uint uVar6;
  
  if (0 < (this->dim_).current_size_) {
    *target = '\n';
    pbVar3 = target + 1;
    uVar6 = this->_dim_cached_byte_size_;
    uVar5 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar3 = (byte)uVar6 | 0x80;
        uVar5 = uVar6 >> 7;
        pbVar3 = pbVar3 + 1;
        bVar2 = 0x3fff < uVar6;
        uVar6 = uVar5;
      } while (bVar2);
    }
    *pbVar3 = (byte)uVar5;
    target = google::protobuf::internal::WireFormatLite::WriteInt64NoTagToArray
                       (&this->dim_,pbVar3 + 1);
  }
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe),target);
    return puVar4;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* BlobShape::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.BlobShape)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 dim = 1 [packed = true];
  if (this->dim_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      1,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _dim_cached_byte_size_, target);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt64NoTagToArray(this->dim_, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.BlobShape)
  return target;
}